

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ElementSelectSyntax::getChild(ElementSelectSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  long in_RDX;
  ConstTokenOrSyntax *in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffa8;
  
  if (in_RDX == 0) {
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffffa8;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x7962b8,token);
  }
  else if (in_RDX == 1) {
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)in_RDI,in_stack_ffffffffffffffa8);
  }
  else if (in_RDX == 2) {
    token_00.info = in_RDI;
    token_00._0_8_ = in_stack_ffffffffffffffa8;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x7962fa,token_00);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RSI,in_RDI);
  }
  return (ConstTokenOrSyntax *)in_RDI;
}

Assistant:

ConstTokenOrSyntax ElementSelectSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return openBracket;
        case 1: return selector;
        case 2: return closeBracket;
        default: return nullptr;
    }
}